

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.h
# Opt level: O2

void __thiscall
mp::QP2Passes::QP2Passes(QP2Passes *this,BasicProblemFlattener *flt,QP2PassVisitor *v)

{
  this->flattener_ = flt;
  this->visitor_ = v;
  (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->n_qp_terms_ = 0;
  (this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ =
       (Impl *)0x0;
  (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (&(this->result_).super_QuadraticExpr);
  return;
}

Assistant:

QP2Passes(BasicProblemFlattener& flt, QP2PassVisitor& v)
      : flattener_(flt), visitor_(v) { }